

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_memory_editor.h
# Opt level: O3

char * __thiscall MemoryEditor::FormatBinary(MemoryEditor *this,uint8_t *buf,int width)

{
  long lVar1;
  ulong uVar2;
  uint uVar3;
  long lVar4;
  bool bVar5;
  
  if (0x40 < width) {
    __assert_fail("width <= 64",
                  "/workspace/llm4binary/github/license_c_cmakelists/binji[P]binjgb/third_party/imgui_memory_editor/imgui_memory_editor.h"
                  ,0x270,"const char *MemoryEditor::FormatBinary(const uint8_t *, int) const");
  }
  if (width < 8) {
    uVar2 = 0;
  }
  else {
    lVar4 = 0;
    uVar2 = (ulong)((uint)width >> 3 & 0x1f);
    do {
      uVar3 = 7;
      do {
        lVar1 = lVar4;
        FormatBinary::out_buf[lVar1] = (buf[uVar2 - 1] >> (uVar3 & 0x1f) & 1) == 0 ^ 0x31;
        bVar5 = uVar3 != 0;
        uVar3 = uVar3 - 1;
        lVar4 = lVar1 + 1;
      } while (bVar5);
      lVar4 = lVar1 + 2;
      FormatBinary::out_buf[lVar1 + 1] = ' ';
      bVar5 = 1 < (long)uVar2;
      uVar2 = uVar2 - 1;
    } while (bVar5);
    uVar2 = lVar1 + 2;
    if (0x48 < uVar2) {
      __assert_fail("out_n < ((int)(sizeof(out_buf) / sizeof(*(out_buf))))",
                    "/workspace/llm4binary/github/license_c_cmakelists/binji[P]binjgb/third_party/imgui_memory_editor/imgui_memory_editor.h"
                    ,0x27a,"const char *MemoryEditor::FormatBinary(const uint8_t *, int) const");
    }
  }
  FormatBinary::out_buf[uVar2] = '\0';
  return FormatBinary::out_buf;
}

Assistant:

const char* FormatBinary(const uint8_t* buf, int width) const
    {
        IM_ASSERT(width <= 64);
        size_t out_n = 0;
        static char out_buf[64 + 8 + 1];
        int n = width / 8;
        for (int j = n - 1; j >= 0; --j)
        {
            for (int i = 0; i < 8; ++i)
                out_buf[out_n++] = (buf[j] & (1 << (7 - i))) ? '1' : '0';
            out_buf[out_n++] = ' ';
        }
        IM_ASSERT(out_n < IM_ARRAYSIZE(out_buf));
        out_buf[out_n] = 0;
        return out_buf;
    }